

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
                 *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  
  operator<<(os,(this->super_Node).type_);
  iVar1 = (*(this->super_Node)._vptr_Node[2])(this);
  if ((char)iVar1 != '\0') {
    poVar2 = std::operator<<(os,' ');
    operator<<(poVar2,&(this->nameAttribute_).attr_);
  }
  poVar2 = std::operator<<(os," ");
  std::ostream::operator<<(poVar2,(this->sizeAttribute_).attr_);
  std::operator<<(os,'\n');
  iVar1 = (*(this->super_Node)._vptr_Node[4])(this);
  if (iVar1 == 0) {
    (*(this->super_Node)._vptr_Node[7])(this);
  }
  if ((uint)((this->super_Node).type_ + ~AVRO_NULL) < 6) {
    poVar2 = std::operator<<(os,"end ");
    poVar2 = operator<<(poVar2,(this->super_Node).type_);
    std::operator<<(poVar2,'\n');
    return;
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}